

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiRowCount(Fts5Context *pCtx,i64 *pnRow)

{
  Fts5Storage *p;
  int iVar1;
  
  p = *(Fts5Storage **)(*(long *)pCtx + 0x28);
  iVar1 = fts5StorageLoadTotals(p,0);
  if (iVar1 == 0) {
    *pnRow = p->nTotalRow;
    iVar1 = 0;
    if (p->nTotalRow < 1) {
      iVar1 = 0x10b;
    }
  }
  return iVar1;
}

Assistant:

static int fts5ApiRowCount(Fts5Context *pCtx, i64 *pnRow){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageRowCount(pTab->pStorage, pnRow);
}